

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomLayout::write(DomLayout *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  long lVar2;
  DomProperty **ppDVar3;
  DomLayoutItem **ppDVar4;
  long lVar5;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QAnyStringView QVar30;
  QAnyStringView QVar31;
  QAnyStringView QVar32;
  QAnyStringView QVar33;
  QAnyStringView QVar34;
  QAnyStringView QVar35;
  QString local_50;
  long local_38;
  
  aVar6._4_4_ = in_register_00000034;
  aVar6._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_50.d.d = (Data *)0x0;
    local_50.d.ptr = L"layout";
    local_50.d.size = 6;
  }
  else {
    QString::toLower_helper(&local_50);
  }
  QVar7.m_size = (size_t)local_50.d.ptr;
  QVar7.field_0.m_data = aVar6.m_data;
  QXmlStreamWriter::writeStartElement(QVar7);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_class == true) {
    pQVar1 = &((this->m_attr_class).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_class).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar9.m_size = (size_t)L"class";
      QVar9.field_0.m_data = aVar6.m_data;
      QVar23.m_size = __n;
      QVar23.field_0.m_data = (void *)0x8000000000000005;
      QXmlStreamWriter::writeAttribute(QVar9,QVar23);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar8.m_size = (size_t)L"class";
      QVar8.field_0.m_data = aVar6.m_data;
      QVar22.m_size = __n;
      QVar22.field_0.m_data = (void *)0x8000000000000005;
      QXmlStreamWriter::writeAttribute(QVar8,QVar22);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_name == true) {
    pQVar1 = &((this->m_attr_name).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_name).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar11.m_size = (size_t)L"name";
      QVar11.field_0.m_data = aVar6.m_data;
      QVar25.m_size = __n;
      QVar25.field_0.m_data = (void *)0x8000000000000004;
      QXmlStreamWriter::writeAttribute(QVar11,QVar25);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar10.m_size = (size_t)L"name";
      QVar10.field_0.m_data = aVar6.m_data;
      QVar24.m_size = __n;
      QVar24.field_0.m_data = (void *)0x8000000000000004;
      QXmlStreamWriter::writeAttribute(QVar10,QVar24);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_stretch == true) {
    pQVar1 = &((this->m_attr_stretch).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_stretch).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar13.m_size = (size_t)L"stretch";
      QVar13.field_0.m_data = aVar6.m_data;
      QVar27.m_size = __n;
      QVar27.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
      QXmlStreamWriter::writeAttribute(QVar13,QVar27);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar12.m_size = (size_t)L"stretch";
      QVar12.field_0.m_data = aVar6.m_data;
      QVar26.m_size = __n;
      QVar26.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
      QXmlStreamWriter::writeAttribute(QVar12,QVar26);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_rowStretch == true) {
    pQVar1 = &((this->m_attr_rowStretch).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_rowStretch).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar15.m_size = (size_t)L"rowstretch";
      QVar15.field_0.m_data = aVar6.m_data;
      QVar29.m_size = __n;
      QVar29.field_0.m_data = (void *)0x800000000000000a;
      QXmlStreamWriter::writeAttribute(QVar15,QVar29);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar14.m_size = (size_t)L"rowstretch";
      QVar14.field_0.m_data = aVar6.m_data;
      QVar28.m_size = __n;
      QVar28.field_0.m_data = (void *)0x800000000000000a;
      QXmlStreamWriter::writeAttribute(QVar14,QVar28);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_columnStretch == true) {
    pQVar1 = &((this->m_attr_columnStretch).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_columnStretch).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar17.m_size = (size_t)L"columnstretch";
      QVar17.field_0.m_data = aVar6.m_data;
      QVar31.m_size = __n;
      QVar31.field_0.m_data = (void *)0x800000000000000d;
      QXmlStreamWriter::writeAttribute(QVar17,QVar31);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar16.m_size = (size_t)L"columnstretch";
      QVar16.field_0.m_data = aVar6.m_data;
      QVar30.m_size = __n;
      QVar30.field_0.m_data = (void *)0x800000000000000d;
      QXmlStreamWriter::writeAttribute(QVar16,QVar30);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_rowMinimumHeight == true) {
    pQVar1 = &((this->m_attr_rowMinimumHeight).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_rowMinimumHeight).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar19.m_size = (size_t)L"rowminimumheight";
      QVar19.field_0.m_data = aVar6.m_data;
      QVar33.m_size = __n;
      QVar33.field_0.m_data = (void *)0x8000000000000010;
      QXmlStreamWriter::writeAttribute(QVar19,QVar33);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar18.m_size = (size_t)L"rowminimumheight";
      QVar18.field_0.m_data = aVar6.m_data;
      QVar32.m_size = __n;
      QVar32.field_0.m_data = (void *)0x8000000000000010;
      QXmlStreamWriter::writeAttribute(QVar18,QVar32);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_columnMinimumWidth == true) {
    pQVar1 = &((this->m_attr_columnMinimumWidth).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_columnMinimumWidth).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar21.m_size = (size_t)L"columnminimumwidth";
      QVar21.field_0.m_data = aVar6.m_data;
      QVar35.m_size = __n;
      QVar35.field_0.m_data = (void *)0x8000000000000012;
      QXmlStreamWriter::writeAttribute(QVar21,QVar35);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar20.m_size = (size_t)L"columnminimumwidth";
      QVar20.field_0.m_data = aVar6.m_data;
      QVar34.m_size = __n;
      QVar34.field_0.m_data = (void *)0x8000000000000012;
      QXmlStreamWriter::writeAttribute(QVar20,QVar34);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  lVar2 = (this->m_property).d.size;
  if (lVar2 != 0) {
    ppDVar3 = (this->m_property).d.ptr;
    lVar5 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"property";
      local_50.d.size = 8;
      DomProperty::write(*(DomProperty **)((long)ppDVar3 + lVar5),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar5 = lVar5 + 8;
    } while (lVar2 << 3 != lVar5);
  }
  lVar2 = (this->m_attribute).d.size;
  if (lVar2 != 0) {
    ppDVar3 = (this->m_attribute).d.ptr;
    lVar5 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"attribute";
      local_50.d.size = 9;
      DomProperty::write(*(DomProperty **)((long)ppDVar3 + lVar5),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar5 = lVar5 + 8;
    } while (lVar2 << 3 != lVar5);
  }
  lVar2 = (this->m_item).d.size;
  if (lVar2 != 0) {
    ppDVar4 = (this->m_item).d.ptr;
    lVar5 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"item";
      local_50.d.size = 4;
      DomLayoutItem::write(*(DomLayoutItem **)((long)ppDVar4 + lVar5),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar5 = lVar5 + 8;
    } while (lVar2 << 3 != lVar5);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomLayout::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layout") : tagName.toLower());

    if (hasAttributeClass())
        writer.writeAttribute(u"class"_s, attributeClass());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    if (hasAttributeStretch())
        writer.writeAttribute(u"stretch"_s, attributeStretch());

    if (hasAttributeRowStretch())
        writer.writeAttribute(u"rowstretch"_s, attributeRowStretch());

    if (hasAttributeColumnStretch())
        writer.writeAttribute(u"columnstretch"_s, attributeColumnStretch());

    if (hasAttributeRowMinimumHeight())
        writer.writeAttribute(u"rowminimumheight"_s, attributeRowMinimumHeight());

    if (hasAttributeColumnMinimumWidth())
        writer.writeAttribute(u"columnminimumwidth"_s, attributeColumnMinimumWidth());

    for (DomProperty *v : m_property)
        v->write(writer, u"property"_s);

    for (DomProperty *v : m_attribute)
        v->write(writer, u"attribute"_s);

    for (DomLayoutItem *v : m_item)
        v->write(writer, u"item"_s);

    writer.writeEndElement();
}